

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O1

void __thiscall
BailOutRecord::RestoreValues
          (BailOutRecord *this,BailOutKind bailOutKind,JavascriptCallStackLayout *layout,
          InterpreterStackFrame *newInstance,ScriptContext *scriptContext,bool fromLoopBody,
          Var *registerSaves,BailOutReturnValue *bailOutReturnValue,Var *pArgumentsObject,
          Var branchValue,void *returnAddress,bool useStartCall,void *argoutRestoreAddress)

{
  uint uVar1;
  GlobalBailOutRecordDataTable *pGVar2;
  StackLiteralBailOutRecord *pSVar3;
  Utf8SourceInfo *pUVar4;
  code *pcVar5;
  bool bVar6;
  RegNum RVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint32 uVar11;
  RegSlot RVar12;
  undefined4 *puVar13;
  Var aValue;
  DynamicObject *this_00;
  FunctionBody *pFVar14;
  ArgOutOffsetInfo *pAVar15;
  ulong uVar16;
  uint index;
  ulong uVar17;
  uint i;
  Var *ppvVar18;
  GlobalBailOutRecordDataRow *pGVar19;
  
  scriptContext->firstInterpreterFrameReturnAddress = returnAddress;
  if ((this->stackLiteralBailOutRecordCount != 0) &&
     (pGVar2 = this->globalBailOutRecordTable, pGVar2->length != 0)) {
    uVar1 = this->m_bailOutRecordId;
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar16 = 0;
    do {
      if (uVar1 <= pGVar2->globalBailOutRecordDataRows[uVar16].end) {
        pGVar19 = pGVar2->globalBailOutRecordDataRows + uVar16;
        if (uVar1 < pGVar19->start) break;
        if (this->stackLiteralBailOutRecordCount != 0) {
          uVar17 = 0;
          do {
            pSVar3 = this->stackLiteralBailOutRecord;
            if (pSVar3[uVar17].regSlot == (*(uint *)&pGVar19->field_0xc & 0x3fffffff)) {
              if ((*(uint *)&pGVar19->field_0xc >> 0x1e & 1) != 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar13 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                   ,0x2ae,"(!row->isFloat)","!row->isFloat");
                if (!bVar6) goto LAB_003fda3c;
                *puVar13 = 0;
              }
              if (*(int *)&pGVar19->field_0xc < 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar13 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                   ,0x2af,"(!row->isInt)","!row->isInt");
                if (!bVar6) goto LAB_003fda3c;
                *puVar13 = 0;
              }
              uVar10 = pGVar19->offset;
              if ((long)(int)uVar10 < 0) {
                aValue = Js::JavascriptCallStackLayout::GetOffset(layout,uVar10);
              }
              else {
                uVar8 = GetBailOutRegisterSaveSlotCount();
                if (uVar8 < uVar10) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar13 = 1;
                  bVar6 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                     ,700,"((uint)offset <= GetBailOutRegisterSaveSlotCount())",
                                     "(uint)offset <= GetBailOutRegisterSaveSlotCount()");
                  if (!bVar6) goto LAB_003fda3c;
                  *puVar13 = 0;
                }
                ppvVar18 = registerSaves;
                if (registerSaves == (Var *)0x0) {
                  ppvVar18 = scriptContext->threadContext->bailOutRegisterSaveSpace;
                }
                RVar7 = LinearScanMD::GetRegisterFromSaveIndex(uVar10);
                if (RegTypes[RVar7] == TyFloat64) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar13 = 1;
                  bVar6 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                     ,0x2be,
                                     "(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64)"
                                     ,
                                     "RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64"
                                    );
                  if (!bVar6) goto LAB_003fda3c;
                  *puVar13 = 0;
                }
                aValue = ppvVar18[(long)(int)uVar10 + -1];
              }
              bVar6 = Js::DynamicObject::IsBaseDynamicObject(aValue);
              if (!bVar6) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar13 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                   ,0x2c1,"(Js::DynamicObject::IsBaseDynamicObject(value))",
                                   "Js::DynamicObject::IsBaseDynamicObject(value)");
                if (!bVar6) goto LAB_003fda3c;
                *puVar13 = 0;
              }
              bVar6 = ThreadContext::IsOnStack(aValue);
              if (!bVar6) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar13 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                   ,0x2c2,"(ThreadContext::IsOnStack(value))",
                                   "ThreadContext::IsOnStack(value)");
                if (!bVar6) goto LAB_003fda3c;
                *puVar13 = 0;
              }
              this_00 = Js::VarTo<Js::DynamicObject>(aValue);
              uVar9 = (*(this_00->super_RecyclableObject).super_FinalizableObject.
                        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[10])(this_00);
              index = pSVar3[uVar17].initFldCount;
              if (index < uVar9) {
                do {
                  Js::DynamicObject::SetSlot(this_00,-1,false,index,(Var)0x0);
                  index = index + 1;
                } while (uVar9 != index);
              }
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 < this->stackLiteralBailOutRecordCount);
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < pGVar2->length);
  }
  if (this->localOffsetsCount != 0) {
    pFVar14 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    if (DAT_015d346a == '\x01') {
      uVar10 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar14);
      if ((pFVar14->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar6) goto LAB_003fda3c;
        *puVar13 = 0;
      }
      bVar6 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015cd718,BailOutPhase,uVar10,
                         ((pFVar14->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                         ptr)->functionId);
      if (bVar6) {
        if (DAT_015d6388 != DAT_015d6390) {
          bVar6 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind);
          if (!bVar6) goto LAB_003fd436;
        }
        Output::Print(L"BailOut:   Register #%3d: Not live\n",0);
      }
    }
LAB_003fd436:
    uVar16 = 1;
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    while( true ) {
      uVar11 = Js::FunctionBody::GetCountField(pFVar14,ConstantCount);
      if (uVar11 <= (uint)uVar16) break;
      if (DAT_015d346a == '\x01') {
        uVar10 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar14);
        if ((pFVar14->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
            (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar6) goto LAB_003fda3c;
          *puVar13 = 0;
        }
        bVar6 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015cd718,BailOutPhase,uVar10,
                           ((pFVar14->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                           ptr)->functionId);
        if (bVar6) {
          if (DAT_015d6388 != DAT_015d6390) {
            bVar6 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind);
            if (!bVar6) goto LAB_003fd538;
          }
          Output::Print(L"BailOut:   Register #%3d: Constant table\n",uVar16);
        }
      }
LAB_003fd538:
      uVar16 = (ulong)((uint)uVar16 + 1);
    }
    pUVar4 = (pFVar14->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
    if ((((pUVar4->debugModeSource).ptr != (uchar *)0x0) || ((pUVar4->field_0xa8 & 0x20) != 0)) &&
       ((pUVar4->field_0xa8 & 0x40) != 0)) {
      AdjustOffsetsForDiagMode(this,layout,*(ScriptFunction **)(newInstance + 0x80));
    }
    RestoreValues(this,bailOutKind,layout,this->localOffsetsCount,(int *)0x0,0,
                  (Var *)(newInstance + 0x160),scriptContext,fromLoopBody,registerSaves,newInstance,
                  pArgumentsObject,(void *)0x0);
  }
  if (((useStartCall) && (this->argOutOffsetInfo != (ArgOutOffsetInfo *)0x0)) &&
     (pAVar15 = this->argOutOffsetInfo, pAVar15->startCallCount != 0)) {
    uVar17 = 0;
    uVar16 = 0;
    do {
      uVar10 = pAVar15->startCallOutParamCounts[uVar17];
      Js::InterpreterStackFrame::OP_StartCall(newInstance,uVar10);
      RestoreValues(this,bailOutKind,layout,uVar10,this->argOutOffsetInfo->outParamOffsets + uVar16,
                    this->argOutOffsetInfo->argOutSymStart + (int)uVar16,
                    *(Var **)(newInstance + 0x28),scriptContext,fromLoopBody,registerSaves,
                    newInstance,pArgumentsObject,(void *)0x0);
      uVar16 = (ulong)((int)uVar16 + uVar10);
      uVar17 = uVar17 + 1;
      pAVar15 = this->argOutOffsetInfo;
    } while (uVar17 < pAVar15->startCallCount);
  }
  if (*(JavascriptFunction **)(newInstance + 0x80) == (JavascriptFunction *)0x0) {
LAB_003fd677:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x2fc,"(newInstance->function && newInstance->function->GetFunctionBody())",
                       "newInstance->function && newInstance->function->GetFunctionBody()");
    if (!bVar6) goto LAB_003fda3c;
    *puVar13 = 0;
  }
  else {
    pFVar14 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    if (pFVar14 == (FunctionBody *)0x0) goto LAB_003fd677;
  }
  if (!fromLoopBody) {
    pFVar14 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    if (((pFVar14->super_ParseableFunctionInfo).m_inParamCount != 0) &&
       (*(long *)(newInstance + 0x40) == 0)) {
      *(Var *)(newInstance + 0x40) = *pArgumentsObject;
    }
  }
  if ((bailOutReturnValue != (BailOutReturnValue *)0x0) &&
     (bailOutReturnValue->returnValueRegSlot != 0xffffffff)) {
    if (bailOutReturnValue->returnValue == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x306,"(bailOutReturnValue->returnValue != nullptr)",
                         "bailOutReturnValue->returnValue != nullptr");
      if (!bVar6) goto LAB_003fda3c;
      *puVar13 = 0;
    }
    uVar1 = bailOutReturnValue->returnValueRegSlot;
    pFVar14 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    RVar12 = Js::FunctionBody::GetLocalsCount(pFVar14);
    if (RVar12 <= uVar1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x307,
                         "(bailOutReturnValue->returnValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount())"
                         ,
                         "bailOutReturnValue->returnValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount()"
                        );
      if (!bVar6) goto LAB_003fda3c;
      *puVar13 = 0;
    }
    *(Var *)(newInstance + (ulong)bailOutReturnValue->returnValueRegSlot * 8 + 0x160) =
         bailOutReturnValue->returnValue;
    if (DAT_015d346a == '\x01') {
      pFVar14 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar10 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar14);
      pFVar14 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      if ((pFVar14->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar6) goto LAB_003fda3c;
        *puVar13 = 0;
      }
      bVar6 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015cd718,BailOutPhase,uVar10,
                         ((pFVar14->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                         ptr)->functionId);
      if (bVar6) {
        if (DAT_015d6388 != DAT_015d6390) {
          bVar6 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind);
          if (!bVar6) goto LAB_003fd8f2;
        }
        Output::Print(L"BailOut:   Register #%3d: Return, value: 0x%p\n",
                      (ulong)bailOutReturnValue->returnValueRegSlot,bailOutReturnValue->returnValue)
        ;
      }
    }
  }
LAB_003fd8f2:
  if (this->branchValueRegSlot == 0xffffffff) goto LAB_003fd9f7;
  if (branchValue == (Var)0x0) {
LAB_003fd919:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x311,"(branchValue && Js::VarIs<Js::JavascriptBoolean>(branchValue))",
                       "branchValue && Js::VarIs<Js::JavascriptBoolean>(branchValue)");
    if (!bVar6) goto LAB_003fda3c;
    *puVar13 = 0;
  }
  else {
    bVar6 = Js::VarIs<Js::JavascriptBoolean>(branchValue);
    if (!bVar6) goto LAB_003fd919;
  }
  uVar1 = this->branchValueRegSlot;
  pFVar14 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
  RVar12 = Js::FunctionBody::GetLocalsCount(pFVar14);
  if (RVar12 <= uVar1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x312,
                       "(branchValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount())"
                       ,
                       "branchValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount()"
                      );
    if (!bVar6) {
LAB_003fda3c:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar13 = 0;
  }
  *(Var *)(newInstance + (ulong)this->branchValueRegSlot * 8 + 0x160) = branchValue;
LAB_003fd9f7:
  ppvVar18 = scriptContext->threadContext->bailOutRegisterSaveSpace;
  uVar10 = GetBailOutRegisterSaveSlotCount();
  memset(ppvVar18,0,(ulong)uVar10 << 3);
  scriptContext->firstInterpreterFrameReturnAddress = (void *)0x0;
  return;
}

Assistant:

void
BailOutRecord::RestoreValues(IR::BailOutKind bailOutKind, Js::JavascriptCallStackLayout * layout, Js::InterpreterStackFrame * newInstance,
    Js::ScriptContext * scriptContext, bool fromLoopBody, Js::Var * registerSaves, BailOutReturnValue * bailOutReturnValue, Js::Var* pArgumentsObject,
    Js::Var branchValue, void * returnAddress, bool useStartCall /* = true */, void * argoutRestoreAddress) const
{
    Js::AutoPushReturnAddressForStackWalker saveReturnAddress(scriptContext, returnAddress);

    if (this->stackLiteralBailOutRecordCount)
    {
        // Null out the field on the stack literal that hasn't fully initialized yet.

        globalBailOutRecordTable->IterateGlobalBailOutRecordTableRows(m_bailOutRecordId, [=](GlobalBailOutRecordDataRow  *row)
        {
            for (uint i = 0; i < this->stackLiteralBailOutRecordCount; i++)
            {
                BailOutRecord::StackLiteralBailOutRecord& record = this->stackLiteralBailOutRecord[i];

                if (record.regSlot == row->regSlot)
                {
                    // Partially initialized stack literal shouldn't be type specialized yet.
                    Assert(!row->isFloat);
                    Assert(!row->isInt);

                    int offset = row->offset;
                    Js::Var value;
                    if (offset < 0)
                    {
                        // Stack offset
                        value = layout->GetOffset(offset);
                    }
                    else
                    {
                        // The value is in register
                        // Index is one based, so subtract one
                        Assert((uint)offset <= GetBailOutRegisterSaveSlotCount());
                        Js::Var * registerSaveSpace = registerSaves ? registerSaves : (Js::Var *)scriptContext->GetThreadContext()->GetBailOutRegisterSaveSpace();
                        Assert(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64);
                        value = registerSaveSpace[offset - 1];
                    }
                    Assert(Js::DynamicObject::IsBaseDynamicObject(value));
                    Assert(ThreadContext::IsOnStack(value));

                    Js::DynamicObject * obj = Js::VarTo<Js::DynamicObject>(value);
                    uint propertyCount = obj->GetPropertyCount();
                    for (uint j = record.initFldCount; j < propertyCount; j++)
                    {
                        obj->SetSlot(SetSlotArgumentsRoot(Js::Constants::NoProperty, false, j, nullptr));
                    }
                }
            }
        });
    }

    if (this->localOffsetsCount)
    {
        Js::FunctionBody* functionBody = newInstance->function->GetFunctionBody();
#if ENABLE_DEBUG_CONFIG_OPTIONS
        BAILOUT_VERBOSE_TRACE(functionBody, bailOutKind, _u("BailOut:   Register #%3d: Not live\n"), 0);

        for (uint i = 1; i < functionBody->GetConstantCount(); i++)
        {
            BAILOUT_VERBOSE_TRACE(functionBody, bailOutKind, _u("BailOut:   Register #%3d: Constant table\n"), i);
        }
#endif

        if (functionBody->IsInDebugMode())
        {
            this->AdjustOffsetsForDiagMode(layout, newInstance->GetJavascriptFunction());
        }

        this->RestoreValues(bailOutKind, layout, this->localOffsetsCount,
            nullptr, 0, newInstance->m_localSlots, scriptContext, fromLoopBody, registerSaves, newInstance, pArgumentsObject);
    }

    if (useStartCall && this->argOutOffsetInfo)
    {
        uint outParamSlot = 0;
        void * argRestoreAddr = nullptr;
        for (uint i = 0; i < this->argOutOffsetInfo->startCallCount; i++)
        {
            uint startCallOutParamCount = this->argOutOffsetInfo->startCallOutParamCounts[i];
#ifdef _M_IX86
            if (argoutRestoreAddress)
            {
                argRestoreAddr = (void*)((char*)argoutRestoreAddress + (this->startCallArgRestoreAdjustCounts[i] * MachPtr));
            }
#endif
            newInstance->OP_StartCall(startCallOutParamCount);
            this->RestoreValues(bailOutKind, layout, startCallOutParamCount, &this->argOutOffsetInfo->outParamOffsets[outParamSlot],
                this->argOutOffsetInfo->argOutSymStart + outParamSlot, newInstance->m_outParams,
                scriptContext, fromLoopBody, registerSaves, newInstance, pArgumentsObject, argRestoreAddr);
            outParamSlot += startCallOutParamCount;
        }
    }

    // If we're not in a loop body, then the arguments object is not on the local frame.
    // If the RestoreValues created an arguments object for us, then it's already on the interpreter instance.
    // Otherwise, we need to propagate the object from the jitted frame to the interpreter.
    Assert(newInstance->function && newInstance->function->GetFunctionBody());
    bool hasArgumentSlot =      // Be consistent with Func::HasArgumentSlot.
        !fromLoopBody && newInstance->function->GetFunctionBody()->GetInParamsCount() != 0;
    if (hasArgumentSlot && newInstance->m_arguments == nullptr)
    {
        newInstance->m_arguments = *pArgumentsObject;
    }

    if (bailOutReturnValue != nullptr && bailOutReturnValue->returnValueRegSlot != Js::Constants::NoRegister)
    {
        Assert(bailOutReturnValue->returnValue != nullptr);
        Assert(bailOutReturnValue->returnValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount());
        newInstance->m_localSlots[bailOutReturnValue->returnValueRegSlot] = bailOutReturnValue->returnValue;

        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("BailOut:   Register #%3d: Return, value: 0x%p\n"),
            bailOutReturnValue->returnValueRegSlot, bailOutReturnValue->returnValue);
    }

    if (branchValueRegSlot != Js::Constants::NoRegister)
    {
        // Used when a t1 = CmCC is optimize to BrCC, and the branch bails out. T1 needs to be restored
        Assert(branchValue && Js::VarIs<Js::JavascriptBoolean>(branchValue));
        Assert(branchValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount());
        newInstance->m_localSlots[branchValueRegSlot] = branchValue;
    }

#if DBG
    // Clear the register save area for the next bailout
    memset((void*)scriptContext->GetThreadContext()->GetBailOutRegisterSaveSpace(), 0, GetBailOutRegisterSaveSlotCount() * sizeof(Js::Var));
#endif
}